

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSSBOLayoutCase.cpp
# Opt level: O0

void __thiscall vkt::ssbo::ShaderInterface::~ShaderInterface(ShaderInterface *this)

{
  StructType *this_00;
  BufferBlock *this_01;
  bool bVar1;
  reference ppSVar2;
  reference ppBVar3;
  __normal_iterator<vkt::ssbo::BufferBlock_**,_std::vector<vkt::ssbo::BufferBlock_*,_std::allocator<vkt::ssbo::BufferBlock_*>_>_>
  local_38;
  __normal_iterator<vkt::ssbo::BufferBlock_**,_std::vector<vkt::ssbo::BufferBlock_*,_std::allocator<vkt::ssbo::BufferBlock_*>_>_>
  local_30;
  iterator i_1;
  __normal_iterator<glu::StructType_**,_std::vector<glu::StructType_*,_std::allocator<glu::StructType_*>_>_>
  local_20;
  __normal_iterator<glu::StructType_**,_std::vector<glu::StructType_*,_std::allocator<glu::StructType_*>_>_>
  local_18;
  iterator i;
  ShaderInterface *this_local;
  
  i._M_current = (StructType **)this;
  local_18._M_current =
       (StructType **)
       std::vector<glu::StructType_*,_std::allocator<glu::StructType_*>_>::begin(&this->m_structs);
  while( true ) {
    local_20._M_current =
         (StructType **)
         std::vector<glu::StructType_*,_std::allocator<glu::StructType_*>_>::end(&this->m_structs);
    bVar1 = __gnu_cxx::operator!=(&local_18,&local_20);
    if (!bVar1) break;
    ppSVar2 = __gnu_cxx::
              __normal_iterator<glu::StructType_**,_std::vector<glu::StructType_*,_std::allocator<glu::StructType_*>_>_>
              ::operator*(&local_18);
    this_00 = *ppSVar2;
    if (this_00 != (StructType *)0x0) {
      glu::StructType::~StructType(this_00);
      operator_delete(this_00,0x38);
    }
    i_1._M_current =
         (BufferBlock **)
         __gnu_cxx::
         __normal_iterator<glu::StructType_**,_std::vector<glu::StructType_*,_std::allocator<glu::StructType_*>_>_>
         ::operator++(&local_18,0);
  }
  local_30._M_current =
       (BufferBlock **)
       std::vector<vkt::ssbo::BufferBlock_*,_std::allocator<vkt::ssbo::BufferBlock_*>_>::begin
                 (&this->m_bufferBlocks);
  while( true ) {
    local_38._M_current =
         (BufferBlock **)
         std::vector<vkt::ssbo::BufferBlock_*,_std::allocator<vkt::ssbo::BufferBlock_*>_>::end
                   (&this->m_bufferBlocks);
    bVar1 = __gnu_cxx::operator!=(&local_30,&local_38);
    if (!bVar1) break;
    ppBVar3 = __gnu_cxx::
              __normal_iterator<vkt::ssbo::BufferBlock_**,_std::vector<vkt::ssbo::BufferBlock_*,_std::allocator<vkt::ssbo::BufferBlock_*>_>_>
              ::operator*(&local_30);
    this_01 = *ppBVar3;
    if (this_01 != (BufferBlock *)0x0) {
      BufferBlock::~BufferBlock(this_01);
      operator_delete(this_01,0x80);
    }
    __gnu_cxx::
    __normal_iterator<vkt::ssbo::BufferBlock_**,_std::vector<vkt::ssbo::BufferBlock_*,_std::allocator<vkt::ssbo::BufferBlock_*>_>_>
    ::operator++(&local_30,0);
  }
  std::vector<vkt::ssbo::BufferBlock_*,_std::allocator<vkt::ssbo::BufferBlock_*>_>::~vector
            (&this->m_bufferBlocks);
  std::vector<glu::StructType_*,_std::allocator<glu::StructType_*>_>::~vector(&this->m_structs);
  return;
}

Assistant:

ShaderInterface::~ShaderInterface (void)
{
	for (std::vector<StructType*>::iterator i = m_structs.begin(); i != m_structs.end(); i++)
		delete *i;

	for (std::vector<BufferBlock*>::iterator i = m_bufferBlocks.begin(); i != m_bufferBlocks.end(); i++)
		delete *i;
}